

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_vector.hpp
# Opt level: O0

void __thiscall duckdb::SelectionVector::Initialize(SelectionVector *this,idx_t count)

{
  SelectionData *this_00;
  data_ptr_t pdVar1;
  shared_ptr<duckdb::SelectionData,_true> *in_RSI;
  undefined8 *in_RDI;
  unsigned_long *in_stack_00000008;
  shared_ptr<duckdb::SelectionData,_true> *in_stack_ffffffffffffffe0;
  shared_ptr<duckdb::SelectionData,_true> *in_stack_ffffffffffffffe8;
  
  make_shared_ptr<duckdb::SelectionData,unsigned_long&>(in_stack_00000008);
  shared_ptr<duckdb::SelectionData,_true>::operator=(in_RSI,in_stack_ffffffffffffffe8);
  shared_ptr<duckdb::SelectionData,_true>::~shared_ptr
            ((shared_ptr<duckdb::SelectionData,_true> *)0x800b42);
  this_00 = shared_ptr<duckdb::SelectionData,_true>::operator->(in_stack_ffffffffffffffe0);
  pdVar1 = AllocatedData::get((AllocatedData *)this_00);
  *in_RDI = pdVar1;
  return;
}

Assistant:

void Initialize(idx_t count = STANDARD_VECTOR_SIZE) {
		selection_data = make_shared_ptr<SelectionData>(count);
		sel_vector = reinterpret_cast<sel_t *>(selection_data->owned_data.get());
	}